

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151776a::entry_to_remove::entry_to_remove
          (entry_to_remove *this,string *name,cmMakefile *makefile)

{
  cmValue cVar1;
  bool bVar2;
  string *psVar3;
  string local_80;
  cmValue local_60;
  cmValue prefix_value;
  string local_48;
  cmValue local_28;
  cmValue to_skip;
  cmMakefile *makefile_local;
  string *name_local;
  entry_to_remove *this_local;
  
  this->count = -1;
  to_skip.Value = (string *)makefile;
  std::__cxx11::string::string((string *)&this->value);
  cVar1.Value = to_skip.Value;
  cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[14]>
            (&local_48,(char (*) [27])"_CMAKE_SYSTEM_PREFIX_PATH_",name,(char (*) [14])0xfaaf97);
  local_28 = cmMakefile::GetDefinition(cVar1.Value,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_28);
    cmStrToLong(psVar3,&this->count);
  }
  cVar1.Value = to_skip.Value;
  cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[14]>
            (&local_80,(char (*) [27])"_CMAKE_SYSTEM_PREFIX_PATH_",name,(char (*) [14])0xfaafc6);
  local_60 = cmMakefile::GetDefinition(cVar1.Value,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  bVar2 = cmValue::operator_cast_to_bool(&local_60);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_60);
    std::__cxx11::string::operator=((string *)&this->value,(string *)psVar3);
  }
  return;
}

Assistant:

entry_to_remove(std::string const& name, cmMakefile* makefile)
    : value()
  {
    if (cmValue to_skip = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_COUNT"))) {
      cmStrToLong(*to_skip, &count);
    }
    if (cmValue prefix_value = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_VALUE"))) {
      value = *prefix_value;
    }
  }